

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparsityStructure.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::SparsityStructure::addDenseBlock
          (SparsityStructure *this,IndexRange *rowsRange,IndexRange *columnsRange)

{
  ulong uVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  uVar1 = iDynTree::IndexRange::isValid();
  if ((uVar1 & 1) == 0) {
    iDynTree::reportError("SparsityStructure","addDenseBlock","The rowsRange is not valid.");
    bVar2 = false;
  }
  else {
    uVar1 = iDynTree::IndexRange::isValid();
    if ((uVar1 & 1) == 0) {
      iDynTree::reportError("SparsityStructure","addDenseBlock","The columnsRange is not valid.");
      bVar2 = false;
    }
    else {
      addDenseBlock((SparsityStructure *)rowsRange,(size_t)columnsRange,unaff_retaddr,
                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool iDynTree::optimalcontrol::SparsityStructure::addDenseBlock(const iDynTree::IndexRange &rowsRange, const iDynTree::IndexRange &columnsRange)
{
    if (!rowsRange.isValid()) {
        reportError("SparsityStructure", "addDenseBlock", "The rowsRange is not valid.");
        return false;
    }

    if (!columnsRange.isValid()) {
        reportError("SparsityStructure", "addDenseBlock", "The columnsRange is not valid.");
        return false;
    }

    addDenseBlock(static_cast<size_t>(rowsRange.offset),
                  static_cast<size_t>(columnsRange.offset),
                  static_cast<size_t>(rowsRange.size),
                  static_cast<size_t>(columnsRange.size));

    return true;
}